

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O0

LocalUCPTriePointer __thiscall
icu_63::Normalizer2DataBuilder::processData(Normalizer2DataBuilder *this)

{
  FILE *__stream;
  UMutableCPTrie *pUVar1;
  int32_t iVar2;
  uint uVar3;
  UErrorCode UVar4;
  int iVar5;
  Norm *norm;
  UErrorCode *pUVar6;
  UCPTrie *pUVar7;
  char *pcVar8;
  uint8_t *puVar9;
  Normalizer2DataBuilder *in_RSI;
  ulong uVar10;
  undefined1 local_448 [4];
  int local_444;
  UVersionInfo nullVersion;
  int32_t i_1;
  int32_t totalSize;
  int32_t offset;
  int32_t minCP;
  UChar32 leadEnd;
  UChar32 start;
  uint32_t andedNorm16;
  uint32_t maxNorm16;
  UChar32 end;
  uint32_t value;
  Norm16Writer norm16Writer;
  UMutableCPTrie *norm16Trie;
  IcuToolErrorCode errorCode;
  undefined1 local_3d0 [4];
  int32_t minNoNoDelta;
  ExtraData extra;
  int32_t i;
  int32_t normsLength;
  Decomposer decomposer;
  undefined1 local_28 [8];
  CompositionBuilder compBuilder;
  Normalizer2DataBuilder *this_local;
  LocalUCPTriePointer *builtTrie;
  
  CompositionBuilder::CompositionBuilder((CompositionBuilder *)local_28,&in_RSI->norms);
  Norms::enumRanges(&in_RSI->norms,(Enumerator *)local_28);
  Decomposer::Decomposer((Decomposer *)&i,&in_RSI->norms);
  do {
    decomposer.super_Enumerator.norms._0_1_ = '\0';
    Norms::enumRanges(&in_RSI->norms,(Enumerator *)&i);
  } while ((char)decomposer.super_Enumerator.norms != '\0');
  extra.previousNoNoMappingsEmpty.hashObj._76_4_ = Norms::length(&in_RSI->norms);
  extra.previousNoNoMappingsEmpty.hashObj.primeIndex = '\x01';
  extra.previousNoNoMappingsEmpty.hashObj.allocated = '\0';
  extra.previousNoNoMappingsEmpty.hashObj._74_2_ = 0;
  for (; (int)extra.previousNoNoMappingsEmpty.hashObj._72_4_ <
         (int)extra.previousNoNoMappingsEmpty.hashObj._76_4_;
      extra.previousNoNoMappingsEmpty.hashObj._72_4_ =
           extra.previousNoNoMappingsEmpty.hashObj._72_4_ + 1) {
    norm = Norms::getNormRefByIndex(&in_RSI->norms,extra.previousNoNoMappingsEmpty.hashObj._72_4_);
    postProcess(in_RSI,norm);
  }
  ExtraData::ExtraData((ExtraData *)local_3d0,&in_RSI->norms,in_RSI->optimization == OPTIMIZE_FAST);
  Norms::enumRanges(&in_RSI->norms,(Enumerator *)local_3d0);
  UnicodeString::operator=
            (&in_RSI->extraData,(UnicodeString *)((long)&extra.maybeYesCompositions.fUnion + 0x30));
  iVar2 = UnicodeString::length(&in_RSI->extraData);
  in_RSI->indexes[10] = iVar2 * 2;
  UnicodeString::append
            (&in_RSI->extraData,(UnicodeString *)((long)&extra.yesYesCompositions.fUnion + 0x30));
  iVar2 = UnicodeString::length(&in_RSI->extraData);
  in_RSI->indexes[0xe] = iVar2 * 2;
  UnicodeString::append
            (&in_RSI->extraData,
             (UnicodeString *)((long)&extra.yesNoMappingsAndCompositions.fUnion + 0x30));
  iVar2 = UnicodeString::length(&in_RSI->extraData);
  in_RSI->indexes[0xb] = iVar2 * 2;
  UnicodeString::append
            (&in_RSI->extraData,(UnicodeString *)((long)&extra.yesNoMappingsOnly.fUnion + 0x30));
  iVar2 = UnicodeString::length(&in_RSI->extraData);
  in_RSI->indexes[0xf] = iVar2 * 2;
  UnicodeString::append
            (&in_RSI->extraData,(UnicodeString *)((long)&extra.noNoMappingsCompYes.fUnion + 0x30));
  iVar2 = UnicodeString::length(&in_RSI->extraData);
  in_RSI->indexes[0x10] = iVar2 * 2;
  UnicodeString::append
            (&in_RSI->extraData,
             (UnicodeString *)((long)&extra.noNoMappingsCompBoundaryBefore.fUnion + 0x30));
  iVar2 = UnicodeString::length(&in_RSI->extraData);
  in_RSI->indexes[0x11] = iVar2 * 2;
  UnicodeString::append
            (&in_RSI->extraData,
             (UnicodeString *)((long)&extra.noNoMappingsCompNoMaybeCC.fUnion + 0x30));
  iVar2 = UnicodeString::length(&in_RSI->extraData);
  in_RSI->indexes[0xc] = iVar2 << 1;
  while (uVar3 = UnicodeString::length((UnicodeString *)&extra.super_Enumerator.norms),
        (uVar3 & 3) != 0) {
    UnicodeString::append((UnicodeString *)&extra.super_Enumerator.norms,L'\0');
  }
  UnicodeString::insert(&in_RSI->extraData,0,(UnicodeString *)&extra.super_Enumerator.norms);
  iVar2 = UnicodeString::length((UnicodeString *)&extra.super_Enumerator.norms);
  in_RSI->indexes[0xd] = iVar2 * -2 + 0xfc00;
  uVar3 = UnicodeString::length(&in_RSI->extraData);
  if ((uVar3 & 1) != 0) {
    UnicodeString::append(&in_RSI->extraData,L'\0');
  }
  errorCode.location._4_4_ = getMinNoNoDelta(in_RSI);
  if ((int)errorCode.location._4_4_ < in_RSI->indexes[0xc]) {
    fprintf(_stderr,"gennorm2 error: data structure overflow, too much mapping composition data\n");
    exit(0xf);
  }
  in_RSI->indexes[8] = 0x110000;
  in_RSI->indexes[9] = 0x110000;
  in_RSI->indexes[0x12] = 0x110000;
  IcuToolErrorCode::IcuToolErrorCode((IcuToolErrorCode *)&norm16Trie,"gennorm2/processData()");
  pUVar6 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)&norm16Trie);
  norm16Writer.norm16Trie = umutablecptrie_open_63(1,1,pUVar6);
  ErrorCode::assertSuccess((ErrorCode *)&norm16Trie);
  Norm16Writer::Norm16Writer((Norm16Writer *)&end,norm16Writer.norm16Trie,&in_RSI->norms,in_RSI);
  Norms::enumRanges(&in_RSI->norms,(Enumerator *)&end);
  setHangulData(in_RSI,norm16Writer.norm16Trie);
  uVar3 = umutablecptrie_getRange_63
                    (norm16Writer.norm16Trie,0xd800,UCPMAP_RANGE_NORMAL,0,(UCPMapValueFilter *)0x0,
                     (void *)0x0,&maxNorm16);
  if ((maxNorm16 != 1) || ((int)uVar3 < 0xdfff)) {
    fprintf(_stderr,"gennorm2 error: not all surrogate code points are inert: U+d800..U+%04x=%lx\n",
            (ulong)uVar3,(ulong)maxNorm16);
    exit(5);
  }
  start = 0;
  leadEnd = 0;
  andedNorm16 = 0;
  minCP = 0x10000;
  while ((minCP <= (int)andedNorm16 ||
         (andedNorm16 = umutablecptrie_getRange_63
                                  (norm16Writer.norm16Trie,minCP,UCPMAP_RANGE_NORMAL,0,
                                   (UCPMapValueFilter *)0x0,(void *)0x0,&maxNorm16),
         pUVar1 = norm16Writer.norm16Trie, -1 < (int)andedNorm16))) {
    pUVar1 = norm16Writer.norm16Trie;
    if ((minCP & 0x3ffU) == 0) {
      leadEnd = maxNorm16;
      start = maxNorm16;
    }
    else {
      if ((uint)start < maxNorm16) {
        start = maxNorm16;
      }
      leadEnd = maxNorm16 & leadEnd;
    }
    if ((int)andedNorm16 < (int)(minCP | 0x3ffU)) {
      minCP = andedNorm16 + 1;
    }
    else {
      if ((uint)in_RSI->indexes[0xc] <= (uint)start) {
        start = in_RSI->indexes[0xc];
      }
      start = start & 0xfffffffeU | leadEnd & 1U;
      if (start != 1) {
        pUVar6 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)&norm16Trie);
        umutablecptrie_set_63(pUVar1,((uint)minCP >> 10) + 0xd7c0 & 0xffff,start,pUVar6);
      }
      if (maxNorm16 == 1) {
        minCP = andedNorm16 + 1 & 0xfffffc00;
      }
      else {
        minCP = (minCP | 0x3ffU) + 1;
      }
    }
  }
  if (0xffff < in_RSI->indexes[8]) {
    in_RSI->indexes[8] = (in_RSI->indexes[8] >> 10) + 0xd7c0U & 0xffff;
  }
  if (0xffff < in_RSI->indexes[9]) {
    in_RSI->indexes[9] = (in_RSI->indexes[9] >> 10) + 0xd7c0U & 0xffff;
  }
  if (0xffff < in_RSI->indexes[0x12]) {
    in_RSI->indexes[0x12] = (in_RSI->indexes[0x12] >> 10) + 0xd7c0U & 0xffff;
  }
  pUVar6 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)&norm16Trie);
  pUVar7 = umutablecptrie_buildImmutable_63(pUVar1,UCPTRIE_TYPE_FAST,UCPTRIE_VALUE_BITS_16,pUVar6);
  LocalUCPTriePointer::LocalUCPTriePointer((LocalUCPTriePointer *)this,pUVar7);
  pUVar7 = LocalPointerBase<UCPTrie>::getAlias((LocalPointerBase<UCPTrie> *)this);
  pUVar6 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)&norm16Trie);
  iVar2 = ucptrie_toBinary_63(pUVar7,(void *)0x0,0,pUVar6);
  in_RSI->norm16TrieLength = iVar2;
  UVar4 = ErrorCode::get((ErrorCode *)&norm16Trie);
  __stream = _stderr;
  if (UVar4 != U_BUFFER_OVERFLOW_ERROR) {
    pcVar8 = ErrorCode::errorName((ErrorCode *)&norm16Trie);
    fprintf(__stream,"gennorm2 error: unable to build/serialize the normalization trie - %s\n",
            pcVar8);
    UVar4 = ErrorCode::reset((ErrorCode *)&norm16Trie);
    exit(UVar4);
  }
  umutablecptrie_close_63(norm16Writer.norm16Trie);
  ErrorCode::reset((ErrorCode *)&norm16Trie);
  uVar10 = (ulong)in_RSI->norm16TrieLength;
  if ((long)uVar10 < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  puVar9 = (uint8_t *)operator_new__(uVar10);
  in_RSI->norm16TrieBytes = puVar9;
  pUVar7 = LocalPointerBase<UCPTrie>::getAlias((LocalPointerBase<UCPTrie> *)this);
  puVar9 = in_RSI->norm16TrieBytes;
  iVar2 = in_RSI->norm16TrieLength;
  pUVar6 = ErrorCode::operator_cast_to_UErrorCode_((ErrorCode *)&norm16Trie);
  ucptrie_toBinary_63(pUVar7,puVar9,iVar2,pUVar6);
  ErrorCode::assertSuccess((ErrorCode *)&norm16Trie);
  in_RSI->indexes[0] = 0x50;
  iVar5 = in_RSI->norm16TrieLength + 0x50;
  in_RSI->indexes[1] = iVar5;
  iVar2 = UnicodeString::length(&in_RSI->extraData);
  iVar5 = iVar2 * 2 + iVar5;
  in_RSI->indexes[2] = iVar5;
  nullVersion = (UVersionInfo)(iVar5 + 0x100);
  for (local_444 = 3; local_444 < 8; local_444 = local_444 + 1) {
    in_RSI->indexes[local_444] = (int32_t)nullVersion;
  }
  if (beVerbose != '\0') {
    printf("size of normalization trie:         %5ld bytes\n",(long)in_RSI->norm16TrieLength);
    iVar2 = UnicodeString::length(&in_RSI->extraData);
    printf("size of 16-bit extra data:          %5ld uint16_t\n",(long)iVar2);
    printf("size of small-FCD data:             %5ld bytes\n",0x100);
    printf("size of binary data file contents:  %5ld bytes\n",(long)(int)nullVersion);
    printf("minDecompNoCodePoint:              U+%04lX\n",(long)in_RSI->indexes[8]);
    printf("minCompNoMaybeCodePoint:           U+%04lX\n",(long)in_RSI->indexes[9]);
    printf("minLcccCodePoint:                  U+%04lX\n",(long)in_RSI->indexes[0x12]);
    printf("minYesNo: (with compositions)      0x%04x\n",(ulong)(uint)in_RSI->indexes[10]);
    printf("minYesNoMappingsOnly:              0x%04x\n",(ulong)(uint)in_RSI->indexes[0xe]);
    printf("minNoNo: (comp-normalized)         0x%04x\n",(ulong)(uint)in_RSI->indexes[0xb]);
    printf("minNoNoCompBoundaryBefore:         0x%04x\n",(ulong)(uint)in_RSI->indexes[0xf]);
    printf("minNoNoCompNoMaybeCC:              0x%04x\n",(ulong)(uint)in_RSI->indexes[0x10]);
    printf("minNoNoEmpty:                      0x%04x\n",(ulong)(uint)in_RSI->indexes[0x11]);
    printf("limitNoNo:                         0x%04x\n",(ulong)(uint)in_RSI->indexes[0xc]);
    printf("minNoNoDelta:                      0x%04x\n",(ulong)errorCode.location._4_4_);
    printf("minMaybeYes:                       0x%04x\n");
  }
  memset(local_448,0,4);
  iVar5 = memcmp(local_448,in_RSI->unicodeVersion,4);
  if (iVar5 == 0) {
    u_versionFromString_63(in_RSI->unicodeVersion,"11.0");
  }
  ::dataInfo.dataVersion = *&in_RSI->unicodeVersion;
  Norm16Writer::~Norm16Writer((Norm16Writer *)&end);
  IcuToolErrorCode::~IcuToolErrorCode((IcuToolErrorCode *)&norm16Trie);
  ExtraData::~ExtraData((ExtraData *)local_3d0);
  Decomposer::~Decomposer((Decomposer *)&i);
  CompositionBuilder::~CompositionBuilder((CompositionBuilder *)local_28);
  return (LocalUCPTriePointer)(LocalPointerBase<UCPTrie>)this;
}

Assistant:

LocalUCPTriePointer Normalizer2DataBuilder::processData() {
    // Build composition lists before recursive decomposition,
    // so that we still have the raw, pair-wise mappings.
    CompositionBuilder compBuilder(norms);
    norms.enumRanges(compBuilder);

    // Recursively decompose all mappings.
    Decomposer decomposer(norms);
    do {
        decomposer.didDecompose=FALSE;
        norms.enumRanges(decomposer);
    } while(decomposer.didDecompose);

    // Set the Norm::Type and other properties.
    int32_t normsLength=norms.length();
    for(int32_t i=1; i<normsLength; ++i) {
        postProcess(norms.getNormRefByIndex(i));
    }

    // Write the properties, mappings and composition lists to
    // appropriate parts of the "extra data" array.
    ExtraData extra(norms, optimization==OPTIMIZE_FAST);
    norms.enumRanges(extra);

    extraData=extra.yesYesCompositions;
    indexes[Normalizer2Impl::IX_MIN_YES_NO]=extraData.length()*2;
    extraData.append(extra.yesNoMappingsAndCompositions);
    indexes[Normalizer2Impl::IX_MIN_YES_NO_MAPPINGS_ONLY]=extraData.length()*2;
    extraData.append(extra.yesNoMappingsOnly);
    indexes[Normalizer2Impl::IX_MIN_NO_NO]=extraData.length()*2;
    extraData.append(extra.noNoMappingsCompYes);
    indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_BOUNDARY_BEFORE]=extraData.length()*2;
    extraData.append(extra.noNoMappingsCompBoundaryBefore);
    indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_NO_MAYBE_CC]=extraData.length()*2;
    extraData.append(extra.noNoMappingsCompNoMaybeCC);
    indexes[Normalizer2Impl::IX_MIN_NO_NO_EMPTY]=extraData.length()*2;
    extraData.append(extra.noNoMappingsEmpty);
    indexes[Normalizer2Impl::IX_LIMIT_NO_NO]=extraData.length()*2;

    // Pad the maybeYesCompositions length to a multiple of 4,
    // so that NO_NO_DELTA bits 2..1 can be used without subtracting the center.
    while(extra.maybeYesCompositions.length()&3) {
        extra.maybeYesCompositions.append((UChar)0);
    }
    extraData.insert(0, extra.maybeYesCompositions);
    indexes[Normalizer2Impl::IX_MIN_MAYBE_YES]=
        Normalizer2Impl::MIN_NORMAL_MAYBE_YES-
        extra.maybeYesCompositions.length()*2;

    // Pad to even length for 4-byte alignment of following data.
    if(extraData.length()&1) {
        extraData.append((UChar)0);
    }

    int32_t minNoNoDelta=getMinNoNoDelta();
    U_ASSERT((minNoNoDelta&7)==0);
    if(indexes[Normalizer2Impl::IX_LIMIT_NO_NO]>minNoNoDelta) {
        fprintf(stderr,
                "gennorm2 error: "
                "data structure overflow, too much mapping composition data\n");
        exit(U_BUFFER_OVERFLOW_ERROR);
    }

    // writeNorm16() and setHangulData() reduce these as needed.
    indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]=0x110000;
    indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]=0x110000;
    indexes[Normalizer2Impl::IX_MIN_LCCC_CP]=0x110000;

    IcuToolErrorCode errorCode("gennorm2/processData()");
    UMutableCPTrie *norm16Trie = umutablecptrie_open(
        Normalizer2Impl::INERT, Normalizer2Impl::INERT, errorCode);
    errorCode.assertSuccess();

    // Map each code point to its norm16 value,
    // including the properties that fit directly,
    // and the offset to the "extra data" if necessary.
    Norm16Writer norm16Writer(norm16Trie, norms, *this);
    norms.enumRanges(norm16Writer);
    // TODO: iterate via getRange() instead of callback?

    setHangulData(norm16Trie);

    // Look for the "worst" norm16 value of any supplementary code point
    // corresponding to a lead surrogate, and set it as that surrogate's value.
    // Enables UTF-16 quick check inner loops to look at only code units.
    //
    // We could be more sophisticated:
    // We could collect a bit set for whether there are values in the different
    // norm16 ranges (yesNo, maybeYes, yesYesWithCC etc.)
    // and select the best value that only breaks the composition and/or decomposition
    // inner loops if necessary.
    // However, that seems like overkill for an optimization for supplementary characters.
    //
    // First check that surrogate code *points* are inert.
    // The parser should have rejected values/mappings for them.
    uint32_t value;
    UChar32 end = umutablecptrie_getRange(norm16Trie, 0xd800, UCPMAP_RANGE_NORMAL, 0,
                                          nullptr, nullptr, &value);
    if (value != Normalizer2Impl::INERT || end < 0xdfff) {
        fprintf(stderr,
                "gennorm2 error: not all surrogate code points are inert: U+d800..U+%04x=%lx\n",
                (int)end, (long)value);
        exit(U_INTERNAL_PROGRAM_ERROR);
    }
    uint32_t maxNorm16 = 0;
    // ANDing values yields 0 bits where any value has a 0.
    // Used for worst-case HAS_COMP_BOUNDARY_AFTER.
    uint32_t andedNorm16 = 0;
    end = 0;
    for (UChar32 start = 0x10000;;) {
        if (start > end) {
            end = umutablecptrie_getRange(norm16Trie, start, UCPMAP_RANGE_NORMAL, 0,
                                          nullptr, nullptr, &value);
            if (end < 0) { break; }
        }
        if ((start & 0x3ff) == 0) {
            // Data for a new lead surrogate.
            maxNorm16 = andedNorm16 = value;
        } else {
            if (value > maxNorm16) {
                maxNorm16 = value;
            }
            andedNorm16 &= value;
        }
        // Intersect each range with the code points for one lead surrogate.
        UChar32 leadEnd = start | 0x3ff;
        if (leadEnd <= end) {
            // End of the supplementary block for a lead surrogate.
            if (maxNorm16 >= (uint32_t)indexes[Normalizer2Impl::IX_LIMIT_NO_NO]) {
                // Set noNo ("worst" value) if it got into "less-bad" maybeYes or ccc!=0.
                // Otherwise it might end up at something like JAMO_VT which stays in
                // the inner decomposition quick check loop.
                maxNorm16 = (uint32_t)indexes[Normalizer2Impl::IX_LIMIT_NO_NO];
            }
            maxNorm16 =
                (maxNorm16 & ~Normalizer2Impl::HAS_COMP_BOUNDARY_AFTER)|
                (andedNorm16 & Normalizer2Impl::HAS_COMP_BOUNDARY_AFTER);
            if (maxNorm16 != Normalizer2Impl::INERT) {
                umutablecptrie_set(norm16Trie, U16_LEAD(start), maxNorm16, errorCode);
            }
            if (value == Normalizer2Impl::INERT) {
                // Potentially skip inert supplementary blocks for several lead surrogates.
                start = (end + 1) & ~0x3ff;
            } else {
                start = leadEnd + 1;
            }
        } else {
            start = end + 1;
        }
    }

    // Adjust supplementary minimum code points to break quick check loops at their lead surrogates.
    // For an empty data file, minCP=0x110000 turns into 0xdc00 (first trail surrogate)
    // which is harmless.
    // As a result, the minimum code points are always BMP code points.
    int32_t minCP=indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP];
    if(minCP>=0x10000) {
        indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]=U16_LEAD(minCP);
    }
    minCP=indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP];
    if(minCP>=0x10000) {
        indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]=U16_LEAD(minCP);
    }
    minCP=indexes[Normalizer2Impl::IX_MIN_LCCC_CP];
    if(minCP>=0x10000) {
        indexes[Normalizer2Impl::IX_MIN_LCCC_CP]=U16_LEAD(minCP);
    }

    LocalUCPTriePointer builtTrie(
        umutablecptrie_buildImmutable(norm16Trie, UCPTRIE_TYPE_FAST, UCPTRIE_VALUE_BITS_16, errorCode));
    norm16TrieLength=ucptrie_toBinary(builtTrie.getAlias(), nullptr, 0, errorCode);
    if(errorCode.get()!=U_BUFFER_OVERFLOW_ERROR) {
        fprintf(stderr, "gennorm2 error: unable to build/serialize the normalization trie - %s\n",
                errorCode.errorName());
        exit(errorCode.reset());
    }
    umutablecptrie_close(norm16Trie);
    errorCode.reset();
    norm16TrieBytes=new uint8_t[norm16TrieLength];
    ucptrie_toBinary(builtTrie.getAlias(), norm16TrieBytes, norm16TrieLength, errorCode);
    errorCode.assertSuccess();

    int32_t offset=(int32_t)sizeof(indexes);
    indexes[Normalizer2Impl::IX_NORM_TRIE_OFFSET]=offset;
    offset+=norm16TrieLength;
    indexes[Normalizer2Impl::IX_EXTRA_DATA_OFFSET]=offset;
    offset+=extraData.length()*2;
    indexes[Normalizer2Impl::IX_SMALL_FCD_OFFSET]=offset;
    offset+=sizeof(smallFCD);
    int32_t totalSize=offset;
    for(int32_t i=Normalizer2Impl::IX_RESERVED3_OFFSET; i<=Normalizer2Impl::IX_TOTAL_SIZE; ++i) {
        indexes[i]=totalSize;
    }

    if(beVerbose) {
        printf("size of normalization trie:         %5ld bytes\n", (long)norm16TrieLength);
        printf("size of 16-bit extra data:          %5ld uint16_t\n", (long)extraData.length());
        printf("size of small-FCD data:             %5ld bytes\n", (long)sizeof(smallFCD));
        printf("size of binary data file contents:  %5ld bytes\n", (long)totalSize);
        printf("minDecompNoCodePoint:              U+%04lX\n", (long)indexes[Normalizer2Impl::IX_MIN_DECOMP_NO_CP]);
        printf("minCompNoMaybeCodePoint:           U+%04lX\n", (long)indexes[Normalizer2Impl::IX_MIN_COMP_NO_MAYBE_CP]);
        printf("minLcccCodePoint:                  U+%04lX\n", (long)indexes[Normalizer2Impl::IX_MIN_LCCC_CP]);
        printf("minYesNo: (with compositions)      0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_YES_NO]);
        printf("minYesNoMappingsOnly:              0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_YES_NO_MAPPINGS_ONLY]);
        printf("minNoNo: (comp-normalized)         0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO]);
        printf("minNoNoCompBoundaryBefore:         0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_BOUNDARY_BEFORE]);
        printf("minNoNoCompNoMaybeCC:              0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO_COMP_NO_MAYBE_CC]);
        printf("minNoNoEmpty:                      0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_NO_NO_EMPTY]);
        printf("limitNoNo:                         0x%04x\n", (int)indexes[Normalizer2Impl::IX_LIMIT_NO_NO]);
        printf("minNoNoDelta:                      0x%04x\n", (int)minNoNoDelta);
        printf("minMaybeYes:                       0x%04x\n", (int)indexes[Normalizer2Impl::IX_MIN_MAYBE_YES]);
    }

    UVersionInfo nullVersion={ 0, 0, 0, 0 };
    if(0==memcmp(nullVersion, unicodeVersion, 4)) {
        u_versionFromString(unicodeVersion, U_UNICODE_VERSION);
    }
    memcpy(dataInfo.dataVersion, unicodeVersion, 4);
    return builtTrie;
}